

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_8e8839::HandlePrependCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  undefined1 auVar3 [16];
  cmValue cVar4;
  ulong uVar5;
  string_view value_00;
  string value;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  cmStringRange local_30;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)pbVar2 - (long)pbVar1;
  if (uVar5 < 0x21) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"sub-command PREPEND requires at least one argument.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0024472e;
  }
  else {
    if (uVar5 == 0x40) goto LAB_0024472e;
    local_30.Begin._M_current = pbVar1 + 2;
    local_48 = 0;
    local_40 = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = &local_40;
    local_50 = &local_40;
    local_30.End._M_current = pbVar2;
    cmJoin(&local_70,&local_30,(string_view)(auVar3 << 0x40),(string_view)ZEXT816(0));
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    cVar4 = cmMakefile::GetDefinition(status->Makefile,pbVar1 + 1);
    if (cVar4.Value != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)((cVar4.Value)->_M_dataplus)._M_p);
    }
    value_00._M_str = local_70._M_dataplus._M_p;
    value_00._M_len = local_70._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,pbVar1 + 1,value_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0024472e;
  }
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
LAB_0024472e:
  return 0x20 < uVar5;
}

Assistant:

bool HandlePrependCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command PREPEND requires at least one argument.");
    return false;
  }

  // Skip if nothing to prepend.
  if (args.size() < 3) {
    return true;
  }

  const std::string& variable = args[1];

  std::string value = cmJoin(cmMakeRange(args).advance(2), std::string());
  cmValue oldValue = status.GetMakefile().GetDefinition(variable);
  if (oldValue) {
    value += *oldValue;
  }
  status.GetMakefile().AddDefinition(variable, value);
  return true;
}